

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kerning.cpp
# Opt level: O3

void dpfb::readValuesForSize
               (Stream *stream,uint32_t subTablePos,LookupContext *ctx,int *values,int valueFormat)

{
  ushort uVar1;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  runtime_error *this;
  byte bVar4;
  uint uVar5;
  ushort uVar6;
  uint uVar7;
  int i;
  long lVar8;
  uint uVar9;
  int i_1;
  int iVar10;
  uint16_t value;
  uint16_t deviceOffsets [4];
  string local_70;
  undefined8 local_50;
  LookupContext *local_48;
  int *local_40;
  ushort auStack_38 [4];
  
  lVar8 = 0;
  do {
    iVar2 = 0;
    if (((uint)valueFormat >> ((uint)lVar8 & 0x1f) & 1) != 0) {
      (*stream->_vptr_Stream[5])(stream,&local_70,2);
      lVar3 = lroundf((float)(int)(short)((ushort)local_70._M_dataplus._M_p << 8 |
                                         (ushort)local_70._M_dataplus._M_p >> 8) * ctx->scale);
      iVar2 = (int)lVar3;
    }
    values[lVar8] = iVar2;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  lVar8 = 0;
  do {
    bVar4 = (byte)lVar8 & 0x1f;
    if (((uint)valueFormat >> bVar4 & 0x10) == 0) {
      uVar1 = (ushort)(0 >> bVar4);
    }
    else {
      (*stream->_vptr_Stream[5])(stream,&local_70,2);
      uVar1 = (ushort)local_70._M_dataplus._M_p << 8 | (ushort)local_70._M_dataplus._M_p >> 8;
    }
    auStack_38[lVar8] = uVar1;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  iVar2 = (*stream->_vptr_Stream[8])(stream);
  local_50 = CONCAT44(extraout_var,iVar2);
  lVar8 = 0;
  local_48 = ctx;
  local_40 = values;
  do {
    if (auStack_38[lVar8] != 0) {
      (*stream->_vptr_Stream[7])(stream,(ulong)(auStack_38[lVar8] + subTablePos),0);
      iVar2 = ctx->pxSize;
      (*stream->_vptr_Stream[5])(stream,&local_70,2);
      uVar6 = (ushort)local_70._M_dataplus._M_p << 8 | (ushort)local_70._M_dataplus._M_p >> 8;
      (*stream->_vptr_Stream[5])(stream,&local_70,2);
      uVar1 = (ushort)local_70._M_dataplus._M_p << 8 | (ushort)local_70._M_dataplus._M_p >> 8;
      if (uVar1 < uVar6) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        str::format_abi_cxx11_
                  (&local_70,"Device table start size (%u) > end size (%u)",(ulong)uVar6,
                   (ulong)(uint)uVar1);
        std::runtime_error::runtime_error(this,(string *)&local_70);
        *(undefined ***)this = &PTR__runtime_error_001277e0;
        __cxa_throw(this,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar9 = iVar2 - (uint)uVar6;
      iVar10 = 0;
      if (iVar2 <= (int)(uint)uVar1 && (int)(uint)uVar6 <= iVar2) {
        (*stream->_vptr_Stream[5])(stream,&local_70,2);
        iVar10 = 0;
        if (0xfffc < (ushort)(((ushort)local_70._M_dataplus._M_p << 8 |
                              (ushort)local_70._M_dataplus._M_p >> 8) - 4)) {
          bVar4 = (byte)((ushort)local_70._M_dataplus._M_p >> 8);
          uVar7 = 0x10 >> (bVar4 & 0x1f);
          iVar2 = (int)uVar9 / (int)uVar7;
          (*stream->_vptr_Stream[7])(stream,(long)iVar2 * 2,1);
          (*stream->_vptr_Stream[5])(stream,&local_70,2);
          uVar5 = 0xff >> ((char)(-1 << (bVar4 & 0x1f)) + 8U & 0x1f);
          uVar9 = (ushort)((ushort)local_70._M_dataplus._M_p << 8 |
                          (ushort)local_70._M_dataplus._M_p >> 8) >>
                  ((byte)(~uVar9 + (iVar2 + 1) * uVar7 << (bVar4 & 0x1f)) & 0x1f) & uVar5;
          uVar5 = uVar5 + 1;
          if (uVar9 < uVar5 >> 1) {
            uVar5 = 0;
          }
          iVar10 = uVar9 - uVar5;
        }
      }
      local_40[lVar8] = local_40[lVar8] + iVar10;
      ctx = local_48;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  (*stream->_vptr_Stream[7])(stream,local_50,0);
  return;
}

Assistant:

static void readValuesForSize(
    Stream& stream,
    std::uint32_t subTablePos,
    const LookupContext& ctx,
    int values[numValues],
    int valueFormat)
{
    for (int i = 0; i < numValues; ++i)
        if (valueFormat & (1 << i))
            values[i] = std::lround(stream.readS16Be() * ctx.scale);
        else
            values[i] = 0;

    std::uint16_t deviceOffsets[numValues];
    for (int i = 0; i < numValues; ++i)
        if (valueFormat & (1 << (i + numValues)))
            deviceOffsets[i] = stream.readU16Be();
        else
            deviceOffsets[i] = 0;

    const auto prevPos = stream.getPosition();
    for (int i = 0; i < numValues; ++i) {
        const auto deviceOffset = deviceOffsets[i];
        if (deviceOffset == 0)
            continue;

        stream.seek(subTablePos + deviceOffset, SeekOrigin::set);
        values[i] += readDeviceAdjsutment(stream, ctx.pxSize);
    }
    stream.seek(prevPos, SeekOrigin::set);
}